

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_reflection_getters
          (t_java_generator *this,ostringstream *out,t_type *type,string *field_name,
          string *cap_name)

{
  int *piVar1;
  uint uVar2;
  ostream *poVar3;
  t_java_generator *this_00;
  char *pcVar4;
  string local_70;
  string local_50;
  
  poVar3 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"case ",5);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  this_00 = (t_java_generator *)(field_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,this_00,
             (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator +
                      field_name->_M_string_length));
  constant_name(&local_50,this_00,&local_70);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return ",7);
  uVar2 = (*(type->super_t_doc)._vptr_t_doc[8])(type);
  pcVar4 = "get";
  if ((char)uVar2 != '\0') {
    pcVar4 = "is";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,(ulong)(uVar2 & 0xff) ^ 3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(cap_name->_M_dataplus)._M_p,cap_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"();",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void t_java_generator::generate_reflection_getters(ostringstream& out,
                                                   t_type* type,
                                                   string field_name,
                                                   string cap_name) {
  indent(out) << "case " << constant_name(field_name) << ":" << endl;
  indent_up();
  indent(out) << "return " << (type->is_bool() ? "is" : "get") << cap_name << "();" << endl << endl;
  indent_down();
}